

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool PrngTest<unsigned_long>
               (hashfunc<unsigned_long> hash,bool testColl,bool testDist,bool drawDiagram)

{
  bool bVar1;
  bool result;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  bool in_stack_0000008b;
  bool in_stack_0000008c;
  bool in_stack_0000008d;
  bool in_stack_0000008e;
  bool in_stack_0000008f;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000090;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffd0;
  pfHash in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe4;
  hashfunc local_8 [8];
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x14f5e3);
  hashfunc::operator_cast_to_function_pointer(local_8);
  Prn_gen<unsigned_long>
            (in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  bVar1 = TestHashList<unsigned_long>
                    (in_stack_00000090,in_stack_0000008f,in_stack_0000008e,in_stack_0000008d,
                     in_stack_0000008c,in_stack_0000008b);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_ffffffffffffffd0);
  return bVar1;
}

Assistant:

bool PrngTest ( hashfunc<hashtype> hash,
                bool testColl, bool testDist, bool drawDiagram )
{

  if (sizeof(hashtype) < 8) {
      printf("The PRNG test is designed for hashes >= 64-bit \n");
      return true;
  }

  //----------

  std::vector<hashtype> hashes;
  Prn_gen(32 << 20, hash, hashes);

  //----------

  bool result = true;

  result &= TestHashList(hashes,drawDiagram,testColl,testDist);

  return result;
}